

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

void __thiscall
Js::PropertyRecord::PropertyRecord
          (PropertyRecord *this,WCHAR *buffer,int length,DWORD bytelength,bool isSymbol)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  bool local_49;
  uint32 local_3c;
  WCHAR local_36;
  uint32 numericValue;
  WCHAR byte;
  PropertyRecord *pPStack_30;
  int i;
  WCHAR *target;
  DWORD local_20;
  int iStack_1c;
  bool isSymbol_local;
  DWORD bytelength_local;
  int length_local;
  WCHAR *buffer_local;
  PropertyRecord *this_local;
  
  target._7_1_ = isSymbol;
  local_20 = bytelength;
  iStack_1c = length;
  _bytelength_local = buffer;
  buffer_local = (WCHAR *)this;
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01de1750;
  this->pid = -1;
  this->isSymbol = (Type)(target._7_1_ & 1);
  this->byteCount = local_20;
  if ((iStack_1c < 0) || (_bytelength_local == (WCHAR *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x1b,"(length >= 0 && buffer != nullptr)",
                                "length >= 0 && buffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPStack_30 = this + 1;
  local_49 = true;
  if (((target._7_1_ & 1) == 0) && (local_49 = true, iStack_1c < 0xb)) {
    local_49 = iStack_1c < 1;
  }
  this->isNumeric = (Type)(local_49 - 1U & 1);
  this->hash = 0x811c9dc5;
  for (numericValue = 0; (int)numericValue < iStack_1c; numericValue = numericValue + 1) {
    local_36 = _bytelength_local[(int)numericValue];
    if (((this->isNumeric & 1U) != 0) && (((ushort)local_36 < 0x30 || (0x39 < (ushort)local_36)))) {
      this->isNumeric = false;
    }
    this->hash = (uint)(ushort)local_36 ^ this->hash;
    this->hash = this->hash * 0x1000193;
    *(WCHAR *)((long)&(pPStack_30->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + (long)(int)numericValue * 2) = local_36;
  }
  *(undefined2 *)
   ((long)&(pPStack_30->super_FinalizableObject).super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject + (long)iStack_1c * 2) = 0;
  if ((this->isNumeric & 1U) != 0) {
    pcVar6 = GetBuffer(this);
    cVar3 = GetLength(this);
    bVar2 = IsPropertyNameNumeric(pcVar6,cVar3,&local_3c);
    uVar4 = local_3c;
    this->isNumeric = bVar2;
    if ((this->isNumeric & 1U) != 0) {
      pcVar6 = GetBuffer(this);
      cVar3 = GetLength(this);
      *(uint32 *)(pcVar6 + (ulong)cVar3 + 1) = uVar4;
      uVar4 = GetNumericValue(this);
      if (uVar4 != local_3c) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                    ,0x36,"(GetNumericValue() == numericValue)",
                                    "GetNumericValue() == numericValue");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  return;
}

Assistant:

PropertyRecord::PropertyRecord(const WCHAR* buffer, const int length, DWORD bytelength, bool isSymbol)
        : pid(Js::Constants::NoProperty), isSymbol(isSymbol), byteCount(bytelength)
    {
        Assert(length >= 0 && buffer != nullptr);

        WCHAR* target = (WCHAR*)((PropertyRecord*)this + 1);
        isNumeric = (isSymbol || length > 10 || length <= 0) ? false : true;
        hash = CC_HASH_OFFSET_VALUE;

        for (int i = 0; i < length; i++)
        {
            const WCHAR byte = buffer[i];
            if (isNumeric)
            {
                if (byte < _u('0') || byte > _u('9'))
                  isNumeric = false;
            }

            CC_HASH_LOGIC(hash, byte);
            target[i] = byte;
        }
        target[length] = WCHAR(0);

        if (isNumeric)
        {
            uint32 numericValue;
            isNumeric = Js::PropertyRecord::IsPropertyNameNumeric(this->GetBuffer(), this->GetLength(), &numericValue);
            if (isNumeric)
            {
                *(uint32 *)(this->GetBuffer() + this->GetLength() + 1) = numericValue;
                Assert(GetNumericValue() == numericValue);
            }
        }
    }